

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QTableView::scrollTo(QTableView *this,QModelIndex *index,ScrollHint hint)

{
  QSpanCollection *this_00;
  long lVar1;
  QAbstractItemModel *pQVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ScrollMode SVar9;
  int iVar10;
  int iVar11;
  Span *pSVar12;
  QScrollBar *pQVar13;
  int iVar14;
  QTableViewPrivate *pQVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  long in_FS_OFFSET;
  ScrollHint local_78;
  int local_64;
  int local_60;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((index->r < 0) || (index->c < 0)) goto LAB_0058b57a;
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  pQVar2 = *(QAbstractItemModel **)(lVar1 + 0x2f8);
  if ((index->m).ptr != pQVar2) goto LAB_0058b57a;
  (**(code **)(*(long *)pQVar2 + 0x68))(&local_50,pQVar2,index);
  cVar4 = comparesEqual((QPersistentModelIndex *)(lVar1 + 0x3b8),&local_50);
  if (((cVar4 == '\0') ||
      (bVar5 = QHeaderView::isSectionHidden
                         (*(QHeaderView **)
                           (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                      super_QFrame.super_QWidget.field_0x8 + 0x588),index->r), bVar5
      )) || (bVar5 = QHeaderView::isSectionHidden
                               (*(QHeaderView **)
                                 (*(long *)&(this->super_QAbstractItemView).
                                            super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                            field_0x8 + 0x580),index->c), bVar5)) goto LAB_0058b57a;
  this_00 = (QSpanCollection *)(lVar1 + 0x650);
  if (*(QSpanCollection **)(lVar1 + 0x650) == this_00) {
    iVar16 = -1;
    local_60 = 0;
    local_64 = -1;
    iVar18 = 0;
  }
  else {
    local_60 = index->r;
    iVar18 = index->c;
    pSVar12 = QSpanCollection::spanAt(this_00,iVar18,local_60);
    iVar16 = iVar18;
    local_64 = local_60;
    if (pSVar12 != (Span *)0x0) {
      local_64 = pSVar12->m_top;
      iVar16 = pSVar12->m_left;
      local_60 = pSVar12->m_bottom;
      iVar18 = pSVar12->m_right;
    }
    iVar18 = iVar18 + 1;
    local_60 = local_60 + 1;
  }
  lVar3 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
  iVar10 = *(int *)(lVar3 + 0x1c);
  iVar11 = *(int *)(lVar3 + 0x14);
  iVar6 = QHeaderView::offset(*(QHeaderView **)(lVar1 + 0x580));
  iVar7 = QHeaderView::sectionPosition(*(QHeaderView **)(lVar1 + 0x580),index->c);
  pQVar15 = *(QTableViewPrivate **)(lVar1 + 0x580);
  iVar8 = QHeaderView::visualIndex((QHeaderView *)pQVar15,index->c);
  if (*(QSpanCollection **)(lVar1 + 0x650) == this_00) {
    iVar18 = QHeaderView::sectionSize(*(QHeaderView **)(lVar1 + 0x580),index->c);
  }
  else {
    iVar18 = QTableViewPrivate::sectionSpanSize
                       (pQVar15,*(QHeaderView **)(lVar1 + 0x580),index->c,iVar18 - iVar16);
  }
  iVar16 = (iVar10 - iVar11) + 1;
  SVar9 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
  if (SVar9 == ScrollPerItem) {
    iVar10 = (iVar7 - iVar6) + iVar18;
    if ((hint == PositionAtCenter) || (iVar16 < iVar10)) {
      iVar11 = iVar8;
      iVar14 = iVar16 / 2;
      if (hint != PositionAtCenter) {
        iVar14 = iVar16;
      }
      do {
        iVar8 = iVar11;
        if (iVar8 < 1) break;
        iVar11 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x580),iVar8 + -1);
        iVar11 = QHeaderView::sectionSize
                           (*(QHeaderView **)
                             (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                        super_QFrame.super_QWidget.field_0x8 + 0x580),iVar11);
        iVar18 = iVar18 + iVar11;
        iVar11 = iVar8 + -1;
      } while (iVar18 <= iVar14);
    }
    if (((hint == PositionAtCenter) || (iVar16 < iVar10)) || (iVar7 - iVar6 < 0)) {
      bVar5 = QHeaderView::sectionsHidden(*(QHeaderView **)(lVar1 + 0x580));
      iVar7 = 0;
      if (0 < iVar8 && bVar5) {
        uVar17 = iVar8 + 1;
        iVar7 = 0;
        do {
          iVar18 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x580),uVar17 - 2);
          bVar5 = QHeaderView::isSectionHidden(*(QHeaderView **)(lVar1 + 0x580),iVar18);
          iVar7 = iVar7 + (uint)bVar5;
          uVar17 = uVar17 - 1;
        } while (1 < uVar17);
      }
      pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar7 = iVar8 - iVar7;
      goto LAB_0058b36c;
    }
  }
  else {
    if (hint == PositionAtCenter) {
      pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar7 = iVar7 - (iVar16 - iVar18) / 2;
    }
    else if ((iVar7 - iVar6 < 0) || (iVar16 < iVar18)) {
      pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    }
    else {
      if ((iVar7 - iVar6) + iVar18 <= iVar16) goto LAB_0058b371;
      pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar7 = (iVar7 - iVar16) + iVar18;
    }
LAB_0058b36c:
    QAbstractSlider::setValue(&pQVar13->super_QAbstractSlider,iVar7);
  }
LAB_0058b371:
  lVar3 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
  iVar18 = *(int *)(lVar3 + 0x20);
  iVar16 = *(int *)(lVar3 + 0x18);
  iVar10 = QHeaderView::offset(*(QHeaderView **)(lVar1 + 0x588));
  iVar11 = QHeaderView::sectionPosition(*(QHeaderView **)(lVar1 + 0x588),index->r);
  pQVar15 = *(QTableViewPrivate **)(lVar1 + 0x588);
  iVar6 = QHeaderView::visualIndex((QHeaderView *)pQVar15,index->r);
  if (*(QSpanCollection **)(lVar1 + 0x650) == this_00) {
    iVar7 = QHeaderView::sectionSize(*(QHeaderView **)(lVar1 + 0x588),index->r);
  }
  else {
    iVar7 = QTableViewPrivate::sectionSpanSize
                      (pQVar15,*(QHeaderView **)(lVar1 + 0x588),index->r,local_60 - local_64);
  }
  iVar18 = (iVar18 - iVar16) + 1;
  if ((iVar11 - iVar10 < 0) || (iVar18 < iVar7)) {
    local_78 = hint + (hint == EnsureVisible);
  }
  else {
    local_78 = hint;
    if ((iVar18 < (iVar11 - iVar10) + iVar7) && (hint == EnsureVisible)) {
      local_78 = PositionAtBottom;
    }
  }
  SVar9 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
  if (SVar9 == ScrollPerItem) {
    if ((local_78 & ~PositionAtTop) == PositionAtBottom) {
      iVar16 = iVar6;
      iVar10 = iVar18 / 2;
      if (local_78 != PositionAtCenter) {
        iVar10 = iVar18;
      }
      do {
        iVar6 = iVar16;
        if (iVar6 < 1) break;
        iVar18 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x588),iVar6 + -1);
        iVar18 = QHeaderView::sectionSize(*(QHeaderView **)(lVar1 + 0x588),iVar18);
        iVar7 = iVar7 + iVar18;
        iVar16 = iVar6 + -1;
      } while (iVar7 <= iVar10);
    }
    if (local_78 - PositionAtTop < 3) {
      bVar5 = QHeaderView::sectionsHidden(*(QHeaderView **)(lVar1 + 0x588));
      iVar11 = 0;
      if (0 < iVar6 && bVar5) {
        uVar17 = iVar6 + 1;
        iVar11 = 0;
        do {
          iVar18 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x588),uVar17 - 2);
          bVar5 = QHeaderView::isSectionHidden(*(QHeaderView **)(lVar1 + 0x588),iVar18);
          iVar11 = iVar11 + (uint)bVar5;
          uVar17 = uVar17 - 1;
        } while (1 < uVar17);
      }
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar11 = iVar6 - iVar11;
      goto LAB_0058b56a;
    }
  }
  else {
    if (local_78 == PositionAtCenter) {
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar11 = iVar11 - (iVar18 - iVar7) / 2;
    }
    else if (local_78 == PositionAtBottom) {
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar11 = (iVar11 - iVar18) + iVar7;
    }
    else {
      if (local_78 != PositionAtTop) goto LAB_0058b56f;
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    }
LAB_0058b56a:
    QAbstractSlider::setValue(&pQVar13->super_QAbstractSlider,iVar11);
  }
LAB_0058b56f:
  QAbstractItemView::update((QAbstractItemView *)this,index);
LAB_0058b57a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QTableView);

    // check if we really need to do anything
    if (!d->isIndexValid(index)
        || (d->model->parent(index) != d->root)
        || isRowHidden(index.row()) || isColumnHidden(index.column()))
        return;

    QSpanCollection::Span span;
    if (d->hasSpans())
        span = d->span(index.row(), index.column());

    // Adjust horizontal position

    int viewportWidth = d->viewport->width();
    int horizontalOffset = d->horizontalHeader->offset();
    int horizontalPosition = d->horizontalHeader->sectionPosition(index.column());
    int horizontalIndex = d->horizontalHeader->visualIndex(index.column());
    int cellWidth = d->hasSpans()
                    ? d->columnSpanWidth(index.column(), span.width())
                    : d->horizontalHeader->sectionSize(index.column());

    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {

        bool positionAtLeft = (horizontalPosition - horizontalOffset < 0);
        bool positionAtRight = (horizontalPosition - horizontalOffset + cellWidth > viewportWidth);

        if (hint == PositionAtCenter || positionAtRight) {
            int w = (hint == PositionAtCenter ? viewportWidth / 2 : viewportWidth);
            int x = cellWidth;
            while (horizontalIndex > 0) {
                x += columnWidth(d->horizontalHeader->logicalIndex(horizontalIndex-1));
                if (x > w)
                    break;
                --horizontalIndex;
            }
        }

        if (positionAtRight || hint == PositionAtCenter || positionAtLeft) {
            int hiddenSections = 0;
            if (d->horizontalHeader->sectionsHidden()) {
                for (int s = horizontalIndex - 1; s >= 0; --s) {
                    int column = d->horizontalHeader->logicalIndex(s);
                    if (d->horizontalHeader->isSectionHidden(column))
                        ++hiddenSections;
                }
            }
            horizontalScrollBar()->setValue(horizontalIndex - hiddenSections);
        }

    } else { // ScrollPerPixel
        if (hint == PositionAtCenter) {
            horizontalScrollBar()->setValue(horizontalPosition - ((viewportWidth - cellWidth) / 2));
        } else {
            if (horizontalPosition - horizontalOffset < 0 || cellWidth > viewportWidth)
                horizontalScrollBar()->setValue(horizontalPosition);
            else if (horizontalPosition - horizontalOffset + cellWidth > viewportWidth)
                horizontalScrollBar()->setValue(horizontalPosition - viewportWidth + cellWidth);
        }
    }

    // Adjust vertical position

    int viewportHeight = d->viewport->height();
    int verticalOffset = d->verticalHeader->offset();
    int verticalPosition = d->verticalHeader->sectionPosition(index.row());
    int verticalIndex = d->verticalHeader->visualIndex(index.row());
    int cellHeight = d->hasSpans()
                     ? d->rowSpanHeight(index.row(), span.height())
                     : d->verticalHeader->sectionSize(index.row());

    if (verticalPosition - verticalOffset < 0 || cellHeight > viewportHeight) {
        if (hint == EnsureVisible)
            hint = PositionAtTop;
    } else if (verticalPosition - verticalOffset + cellHeight > viewportHeight) {
        if (hint == EnsureVisible)
            hint = PositionAtBottom;
    }

    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {

        if (hint == PositionAtBottom || hint == PositionAtCenter) {
            int h = (hint == PositionAtCenter ? viewportHeight / 2 : viewportHeight);
            int y = cellHeight;
            while (verticalIndex > 0) {
                int row = d->verticalHeader->logicalIndex(verticalIndex - 1);
                y += d->verticalHeader->sectionSize(row);
                if (y > h)
                    break;
                --verticalIndex;
            }
        }

        if (hint == PositionAtBottom || hint == PositionAtCenter || hint == PositionAtTop) {
            int hiddenSections = 0;
            if (d->verticalHeader->sectionsHidden()) {
                for (int s = verticalIndex - 1; s >= 0; --s) {
                    int row = d->verticalHeader->logicalIndex(s);
                    if (d->verticalHeader->isSectionHidden(row))
                        ++hiddenSections;
                }
            }
            verticalScrollBar()->setValue(verticalIndex - hiddenSections);
        }

    } else { // ScrollPerPixel
        if (hint == PositionAtTop) {
            verticalScrollBar()->setValue(verticalPosition);
        } else if (hint == PositionAtBottom) {
            verticalScrollBar()->setValue(verticalPosition - viewportHeight + cellHeight);
        } else if (hint == PositionAtCenter) {
            verticalScrollBar()->setValue(verticalPosition - ((viewportHeight - cellHeight) / 2));
        }
    }

    update(index);
}